

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_compiler_set_member_decoration_string
               (spvc_compiler compiler,spvc_type_id id,uint member_index,SpvDecoration decoration,
               char *argument)

{
  char *pcVar1;
  Decoration decoration_00;
  uint index;
  pointer this;
  allocator local_51;
  string local_50;
  TypeID local_2c;
  char *local_28;
  char *argument_local;
  uint local_18;
  SpvDecoration decoration_local;
  uint member_index_local;
  spvc_type_id id_local;
  spvc_compiler compiler_local;
  
  local_28 = argument;
  argument_local._4_4_ = decoration;
  local_18 = member_index;
  decoration_local = id;
  _member_index_local = compiler;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::TypedID<(spirv_cross::Types)1>::TypedID(&local_2c,decoration_local);
  index = local_18;
  decoration_00 = argument_local._4_4_;
  pcVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
  spirv_cross::Compiler::set_member_decoration_string(this,local_2c,index,decoration_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void spvc_compiler_set_member_decoration_string(spvc_compiler compiler, spvc_type_id id, unsigned member_index,
                                                SpvDecoration decoration, const char *argument)
{
	compiler->compiler->set_member_decoration_string(id, member_index, static_cast<spv::Decoration>(decoration),
	                                                 argument);
}